

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::CodeHolder::newSection
          (CodeHolder *this,Section **sectionOut,char *name,size_t nameSize,SectionFlags flags,
          uint32_t alignment,int32_t order)

{
  bool bVar1;
  ZoneVector<asmjit::_abi_1_10::Section_*> *this_00;
  iterator ppSVar2;
  Section **item;
  size_t in_RCX;
  char *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  size_t index;
  SectionFlags in_R8D;
  uint in_R9D;
  int32_t in_stack_00000008;
  Section **insertPosition;
  Section *section;
  Error _err_1;
  Error _err;
  uint32_t sectionId;
  Section **in_stack_ffffffffffffff78;
  ZoneAllocator *in_stack_ffffffffffffff80;
  ZoneAllocator *in_stack_ffffffffffffff88;
  ZoneVector<asmjit::_abi_1_10::Section_*> *in_stack_ffffffffffffff90;
  Section *local_48;
  Error local_3c;
  Error local_38;
  size_type local_34;
  uint local_30;
  SectionFlags local_2c;
  size_t local_28;
  char *local_20;
  undefined8 *local_18;
  Error local_4;
  
  *in_RSI = 0;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_RCX == 0xffffffffffffffff) {
    local_28 = strlen(in_RDX);
  }
  if (local_30 == 0) {
    local_30 = 1;
  }
  bVar1 = Support::isPowerOf2<unsigned_int>(local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (local_28 < 0x24) {
      local_34 = ZoneVectorBase::size((ZoneVectorBase *)(in_RDI + 0xd0));
      if (local_34 == 0xffffffff) {
        local_4 = DebugUtils::errored(0x14);
      }
      else {
        local_38 = ZoneVector<asmjit::_abi_1_10::Section_*>::willGrow
                             (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        local_4 = local_38;
        if ((local_38 == 0) &&
           (local_3c = ZoneVector<asmjit::_abi_1_10::Section_*>::willGrow
                                 (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                  (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20)),
           local_4 = local_3c, local_3c == 0)) {
          local_48 = ZoneAllocator::allocZeroedT<asmjit::_abi_1_10::Section>
                               (in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
          if (local_48 == (Section *)0x0) {
            local_4 = DebugUtils::errored(1);
          }
          else {
            local_48->_id = local_34;
            local_48->_flags = local_2c;
            local_48->_alignment = local_30;
            local_48->_order = in_stack_00000008;
            memcpy(&local_48->_name,local_20,local_28);
            index = in_RDI + 0xe0;
            this_00 = (ZoneVector<asmjit::_abi_1_10::Section_*> *)
                      ZoneVector<asmjit::_abi_1_10::Section_*>::begin
                                ((ZoneVector<asmjit::_abi_1_10::Section_*> *)0x11a01e);
            ppSVar2 = ZoneVector<asmjit::_abi_1_10::Section_*>::end
                                ((ZoneVector<asmjit::_abi_1_10::Section_*> *)
                                 in_stack_ffffffffffffff80);
            std::
            lower_bound<asmjit::_abi_1_10::Section**,asmjit::_abi_1_10::Section*,asmjit::_abi_1_10::CodeHolder::newSection(asmjit::_abi_1_10::Section**,char_const*,unsigned_long,asmjit::_abi_1_10::SectionFlags,unsigned_int,int)::__0>
                      (this_00,ppSVar2,&local_48);
            ZoneVector<asmjit::_abi_1_10::Section_*>::appendUnsafe
                      ((ZoneVector<asmjit::_abi_1_10::Section_*> *)in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff78);
            item = (Section **)(in_RDI + 0xe0);
            ZoneVector<asmjit::_abi_1_10::Section_*>::data
                      ((ZoneVector<asmjit::_abi_1_10::Section_*> *)(in_RDI + 0xe0));
            ZoneVector<asmjit::_abi_1_10::Section_*>::insertUnsafe(this_00,index,item);
            *local_18 = local_48;
            local_4 = 0;
          }
        }
      }
    }
    else {
      local_4 = DebugUtils::errored(0x15);
    }
  }
  else {
    local_4 = DebugUtils::errored(2);
  }
  return local_4;
}

Assistant:

Error CodeHolder::newSection(Section** sectionOut, const char* name, size_t nameSize, SectionFlags flags, uint32_t alignment, int32_t order) noexcept {
  *sectionOut = nullptr;

  if (nameSize == SIZE_MAX)
    nameSize = strlen(name);

  if (alignment == 0)
    alignment = 1;

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(alignment)))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(nameSize > Globals::kMaxSectionNameSize))
    return DebugUtils::errored(kErrorInvalidSectionName);

  uint32_t sectionId = _sections.size();
  if (ASMJIT_UNLIKELY(sectionId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManySections);

  ASMJIT_PROPAGATE(_sections.willGrow(&_allocator));
  ASMJIT_PROPAGATE(_sectionsByOrder.willGrow(&_allocator));

  Section* section = _allocator.allocZeroedT<Section>();
  if (ASMJIT_UNLIKELY(!section))
    return DebugUtils::errored(kErrorOutOfMemory);

  section->_id = sectionId;
  section->_flags = flags;
  section->_alignment = alignment;
  section->_order = order;
  memcpy(section->_name.str, name, nameSize);

  Section** insertPosition = std::lower_bound(_sectionsByOrder.begin(), _sectionsByOrder.end(), section, [](const Section* a, const Section* b) {
    return std::make_tuple(a->order(), a->id()) < std::make_tuple(b->order(), b->id());
  });

  _sections.appendUnsafe(section);
  _sectionsByOrder.insertUnsafe((size_t)(insertPosition - _sectionsByOrder.data()), section);

  *sectionOut = section;
  return kErrorOk;
}